

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostore.c
# Opt level: O2

int ostore_getObjectIdFromIndex(TOStoreHnd store,uint32_t objectIndex,TOStoreObjID *id)

{
  int iVar1;
  uint uVar2;
  uint32_t position;
  uint32_t i;
  uint uVar3;
  TDskObjIndex header;
  
  if (store == (TOStoreHnd)0x0) {
    __assert_fail("store != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/woodsmc[P]ostore/ostore/ostore.c"
                  ,200,"int ostore_getObjectIdFromIndex(TOStoreHnd, uint32_t, TOStoreObjID *)");
  }
  if (id != (TOStoreObjID *)0x0) {
    uVar2 = store->numberOfObjects;
    if (uVar2 <= objectIndex) {
      __assert_fail("objectIndex < store->numberOfObjects",
                    "/workspace/llm4binary/github/license_c_cmakelists/woodsmc[P]ostore/ostore/ostore.c"
                    ,0xcc,"int ostore_getObjectIdFromIndex(TOStoreHnd, uint32_t, TOStoreObjID *)");
    }
    uVar3 = 0;
    iVar1 = -1;
    position = 4;
    while( true ) {
      if (uVar2 <= uVar3) {
        return iVar1;
      }
      header.id = 0;
      header.headBlock = 0;
      header.tailBlock = 0;
      header.numberOfBlocks = 0;
      iVar1 = readWithIndex(store,&(store->tableOfObjectsHeader).header,position,0x10,&header);
      if (iVar1 != 0) break;
      if (objectIndex == uVar3) {
        *id = header.id;
        return 0;
      }
      uVar3 = uVar3 + 1;
      uVar2 = store->numberOfObjects;
      position = position + 0x10;
      iVar1 = 0;
    }
    return iVar1;
  }
  __assert_fail("id != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/woodsmc[P]ostore/ostore/ostore.c"
                ,0xc9,"int ostore_getObjectIdFromIndex(TOStoreHnd, uint32_t, TOStoreObjID *)");
}

Assistant:

int ostore_getObjectIdFromIndex(TOStoreHnd store, uint32_t objectIndex, TOStoreObjID* id) {
    assert(store != NULL);
    assert(id != NULL);

    START;
    assert(objectIndex < store->numberOfObjects);
    uint32_t offset = sizeof(uint32_t);

    retval = ERR_NOT_FOUND;
    for(uint32_t i = 0; i < store->numberOfObjects; i++) {
        LOCAL_MEMZ(TDskObjIndex, header);
        offset = (i * sizeof(TDskObjIndex)) + sizeof(uint32_t);
        retval = readWithIndex(store, &store->tableOfObjectsHeader.header, offset, sizeof(TDskObjIndex), &header);
        IF_NOT_OK_HANDLE_ERROR(retval);
        if (i == objectIndex) {
            (*id) = header.id;
            break;
        }
    }

    PROCESS_ERROR;

    FINISH;
}